

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O3

int set_extra(int argc,char **argv)

{
  char *__s;
  zip_t *pzVar1;
  zip_flags_t zVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  ulonglong uVar5;
  ulonglong uVar6;
  ulonglong uVar7;
  size_t sVar8;
  undefined4 uVar9;
  
  uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
  uVar5 = strtoull(*argv,(char **)0x0,10);
  uVar6 = strtoull(argv[1],(char **)0x0,10);
  uVar7 = strtoull(argv[2],(char **)0x0,10);
  zVar2 = get_flags(argv[3]);
  pzVar1 = za;
  __s = argv[4];
  sVar8 = strlen(__s);
  iVar3 = zip_file_extra_field_set
                    (pzVar1,uVar5,(uint)uVar6 & 0xffff,(uint)uVar7 & 0xffff,__s,(uint)sVar8 & 0xffff
                     ,CONCAT44(uVar9,zVar2));
  iVar4 = 0;
  if (iVar3 < 0) {
    set_extra_cold_1();
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int
set_extra(int argc, char *argv[]) {
    zip_flags_t geflags;
    zip_uint16_t eid, eidx;
    const zip_uint8_t *efdata;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    eid = (zip_uint16_t)strtoull(argv[1], NULL, 10);
    eidx = (zip_uint16_t)strtoull(argv[2], NULL, 10);
    geflags = get_flags(argv[3]);
    efdata = (zip_uint8_t *)argv[4];
    if ((zip_file_extra_field_set(za, idx, eid, eidx, efdata, (zip_uint16_t)strlen((const char *)efdata), geflags)) < 0) {
	fprintf(stderr, "can't set extra field data for file at index '%" PRIu64 "', extra field id '%d', index '%d': %s\n", idx, eid, eidx, zip_strerror(za));
	return -1;
    }
    return 0;
}